

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CMU462::Matrix3x3::operator*(Matrix3x3 *this,Matrix3x3 *B)

{
  double dVar1;
  double *pdVar2;
  Matrix3x3 *in_RDI;
  int k;
  int j;
  int i;
  Matrix3x3 *A;
  Matrix3x3 *C;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  Matrix3x3 *in_stack_ffffffffffffffb0;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  Matrix3x3(in_RDI);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pdVar2 = operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                          in_stack_ffffffffffffffa8);
      *pdVar2 = 0.0;
      for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
        pdVar2 = operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffb0 = (Matrix3x3 *)*pdVar2;
        pdVar2 = operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
        dVar1 = *pdVar2;
        pdVar2 = operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                            in_stack_ffffffffffffffa8);
        *pdVar2 = (double)in_stack_ffffffffffffffb0 * dVar1 + *pdVar2;
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }